

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

aiScene * aiApplyPostProcessing(aiScene *pScene,uint pFlags)

{
  ScenePrivateData *pSVar1;
  ScenePrivateData *priv;
  aiScene *sc;
  uint pFlags_local;
  aiScene *pScene_local;
  
  pSVar1 = Assimp::ScenePriv(pScene);
  if ((pSVar1 == (ScenePrivateData *)0x0) || (pSVar1->mOrigImporter == (Importer *)0x0)) {
    ReportSceneNotFoundError();
    pScene_local = (aiScene *)0x0;
  }
  else {
    pScene_local = Assimp::Importer::ApplyPostProcessing(pSVar1->mOrigImporter,pFlags);
    if (pScene_local == (aiScene *)0x0) {
      aiReleaseImport(pScene);
      pScene_local = (aiScene *)0x0;
    }
  }
  return pScene_local;
}

Assistant:

ASSIMP_API const aiScene* aiApplyPostProcessing(const aiScene* pScene,
    unsigned int pFlags)
{
    const aiScene* sc = NULL;


    ASSIMP_BEGIN_EXCEPTION_REGION();

    // find the importer associated with this data
    const ScenePrivateData* priv = ScenePriv(pScene);
    if( !priv || !priv->mOrigImporter)  {
        ReportSceneNotFoundError();
        return NULL;
    }

    sc = priv->mOrigImporter->ApplyPostProcessing(pFlags);

    if (!sc) {
        aiReleaseImport(pScene);
        return NULL;
    }

    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return sc;
}